

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::CheckComponents(cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  bool bVar1;
  TargetType TVar2;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *this_01;
  size_type sVar4;
  reference piVar5;
  reference ppcVar6;
  const_iterator cStack_50;
  int ni;
  const_iterator __end2;
  const_iterator __begin2;
  NodeList *__range2;
  NodeList *nl;
  int c;
  int nc;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  sVar3 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  nl._0_4_ = 0;
  do {
    if ((int)sVar3 <= (int)nl) {
      return true;
    }
    this_01 = &std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                         (this_00,(long)(int)nl)->super_vector<int,_std::allocator<int>_>;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(this_01);
    if (1 < sVar4) {
      if ((this->NoCycles & 1U) != 0) {
        ComplainAboutBadComponent(this,ccg,(int)nl,false);
        return false;
      }
      __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
      cStack_50 = std::vector<int,_std::allocator<int>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0), bVar1) {
        piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        ppcVar6 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::operator[](&this->Targets,(long)*piVar5);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar6);
        if (TVar2 != STATIC_LIBRARY) {
          ComplainAboutBadComponent(this,ccg,(int)nl,false);
          return false;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
    }
    nl._0_4_ = (int)nl + 1;
  } while( true );
}

Assistant:

bool cmComputeTargetDepends::CheckComponents(
  cmComputeComponentGraph const& ccg)
{
  // All non-trivial components should consist only of static
  // libraries.
  std::vector<NodeList> const& components = ccg.GetComponents();
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // Immediately complain if no cycles are allowed at all.
    if (this->NoCycles) {
      this->ComplainAboutBadComponent(ccg, c);
      return false;
    }

    // Make sure the component is all STATIC_LIBRARY targets.
    for (int ni : nl) {
      if (this->Targets[ni]->GetType() != cmStateEnums::STATIC_LIBRARY) {
        this->ComplainAboutBadComponent(ccg, c);
        return false;
      }
    }
  }
  return true;
}